

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

bool __thiscall
kernel::BlockTreeDB::WriteBatchSync
          (BlockTreeDB *this,
          vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
          *fileInfo,int nLastFile,
          vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *blockinfo)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  const_iterator batch_00;
  const_iterator cVar4;
  reference ppCVar5;
  CDBWrapper *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *bi;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *__range1_1;
  type *info;
  type *file;
  vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
  *__range1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  CDBBatch batch;
  CDBBatch *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  pair<unsigned_char,_int> in_stack_fffffffffffffe08;
  CDBBatch *in_stack_fffffffffffffe18;
  CBlockIndex *this_00;
  pair<unsigned_char,_int> in_stack_fffffffffffffe80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CDBBatch::CDBBatch(in_stack_fffffffffffffe18,in_RDI);
  std::
  vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
  ::begin((vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
           *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  std::
  vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
  ::end((vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>
         *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_std::pair<int,_const_CBlockFileInfo_*>_*,_std::vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>_>
                      ((__normal_iterator<const_std::pair<int,_const_CBlockFileInfo_*>_*,_std::vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>_>
                        *)in_stack_fffffffffffffe08,
                       (__normal_iterator<const_std::pair<int,_const_CBlockFileInfo_*>_*,_std::vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_const_CBlockFileInfo_*>_*,_std::vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>_>
    ::operator*((__normal_iterator<const_std::pair<int,_const_CBlockFileInfo_*>_*,_std::vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>_>
                 *)in_stack_fffffffffffffdf8);
    std::get<0ul,int,CBlockFileInfo_const*>
              ((pair<int,_const_CBlockFileInfo_*> *)in_stack_fffffffffffffdf8);
    std::get<1ul,int,CBlockFileInfo_const*>
              ((pair<int,_const_CBlockFileInfo_*> *)in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffe08 =
         std::make_pair<unsigned_char_const&,int_const&>
                   ((uchar *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                    (int *)in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffe80 = in_stack_fffffffffffffe08;
    CDBBatch::Write<std::pair<unsigned_char,int>,CBlockFileInfo>
              (in_stack_fffffffffffffe18,(pair<unsigned_char,_int> *)in_RDI,
               (CBlockFileInfo *)in_stack_fffffffffffffe08);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_const_CBlockFileInfo_*>_*,_std::vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<int,_const_CBlockFileInfo_*>_*,_std::vector<std::pair<int,_const_CBlockFileInfo_*>,_std::allocator<std::pair<int,_const_CBlockFileInfo_*>_>_>_>
                  *)in_stack_fffffffffffffdf8);
  }
  CDBBatch::Write<unsigned_char,int>
            (in_stack_fffffffffffffe18,(uchar *)in_RDI,(int *)in_stack_fffffffffffffe08);
  batch_00 = std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::begin
                       ((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *)
                        CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  cVar4 = std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::end
                    ((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *)
                     CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_CBlockIndex_*const_*,_std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>_>
                      ((__normal_iterator<const_CBlockIndex_*const_*,_std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>_>
                        *)in_stack_fffffffffffffe08,
                       (__normal_iterator<const_CBlockIndex_*const_*,_std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppCVar5 = __gnu_cxx::
              __normal_iterator<const_CBlockIndex_*const_*,_std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>_>
              ::operator*((__normal_iterator<const_CBlockIndex_*const_*,_std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>_>
                           *)in_stack_fffffffffffffdf8);
    this_00 = *ppCVar5;
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffffe08);
    std::make_pair<unsigned_char_const&,uint256>
              ((uchar *)in_stack_fffffffffffffe08,
               (uint256 *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    CDiskBlockIndex::CDiskBlockIndex
              ((CDiskBlockIndex *)in_stack_fffffffffffffe08,
               (CBlockIndex *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    CDBBatch::Write<std::pair<unsigned_char,uint256>,CDiskBlockIndex>
              ((CDBBatch *)this_00,(pair<unsigned_char,_uint256> *)in_RDI,
               (CDiskBlockIndex *)in_stack_fffffffffffffe08);
    __gnu_cxx::
    __normal_iterator<const_CBlockIndex_*const_*,_std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>_>
    ::operator++((__normal_iterator<const_CBlockIndex_*const_*,_std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>_>
                  *)in_stack_fffffffffffffdf8);
  }
  bVar3 = ::CDBWrapper::WriteBatch
                    ((CDBWrapper *)in_stack_fffffffffffffe80,(CDBBatch *)batch_00._M_current,
                     SUB81((ulong)cVar4._M_current >> 0x38,0));
  CDBBatch::~CDBBatch(in_stack_fffffffffffffdf8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool BlockTreeDB::WriteBatchSync(const std::vector<std::pair<int, const CBlockFileInfo*>>& fileInfo, int nLastFile, const std::vector<const CBlockIndex*>& blockinfo)
{
    CDBBatch batch(*this);
    for (const auto& [file, info] : fileInfo) {
        batch.Write(std::make_pair(DB_BLOCK_FILES, file), *info);
    }
    batch.Write(DB_LAST_BLOCK, nLastFile);
    for (const CBlockIndex* bi : blockinfo) {
        batch.Write(std::make_pair(DB_BLOCK_INDEX, bi->GetBlockHash()), CDiskBlockIndex{bi});
    }
    return WriteBatch(batch, true);
}